

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_67a627::DoFullParse::operator()
          (DoFullParse *this,TParseContextBase *parseContext,TPpContext *ppContext,
          TInputScanner *fullInput,bool versionWillBeError,TSymbolTable *param_5,
          TIntermediate *intermediate,EShOptimizationLevel optLevel,EShMessages messages)

{
  TInfoSink *this_00;
  uint uVar1;
  EShLanguage EVar2;
  int n;
  TIntermNode *pTVar3;
  TInfoSinkBase *this_01;
  bool local_39;
  bool success;
  TSymbolTable *param_5_local;
  bool versionWillBeError_local;
  TInputScanner *fullInput_local;
  TPpContext *ppContext_local;
  TParseContextBase *parseContext_local;
  DoFullParse *this_local;
  
  uVar1 = (*(parseContext->super_TParseVersions)._vptr_TParseVersions[0x3b])
                    (parseContext,ppContext,fullInput,(ulong)versionWillBeError,intermediate);
  local_39 = (uVar1 & 1) != 0;
  if ((local_39) &&
     (pTVar3 = glslang::TIntermediate::getTreeRoot(intermediate), pTVar3 != (TIntermNode *)0x0)) {
    if (optLevel == EShOptNoGeneration) {
      glslang::TInfoSinkBase::message
                (&((parseContext->super_TParseVersions).infoSink)->info,EPrefixNone,
                 "No errors.  No code generation or linking was requested.");
    }
    else {
      pTVar3 = glslang::TIntermediate::getTreeRoot(intermediate);
      EVar2 = glslang::TParseContextBase::getLanguage(parseContext);
      local_39 = glslang::TIntermediate::postProcess(intermediate,pTVar3,EVar2);
    }
  }
  else if (!local_39) {
    glslang::TInfoSinkBase::prefix
              (&((parseContext->super_TParseVersions).infoSink)->info,EPrefixError);
    this_00 = (parseContext->super_TParseVersions).infoSink;
    n = glslang::TParseVersions::getNumErrors(&parseContext->super_TParseVersions);
    this_01 = glslang::TInfoSinkBase::operator<<(&this_00->info,n);
    glslang::TInfoSinkBase::operator<<(this_01," compilation errors.  No code generated.\n\n");
  }
  if ((messages & EShMsgAST) != EShMsgDefault) {
    glslang::TIntermediate::output(intermediate,(parseContext->super_TParseVersions).infoSink,true);
  }
  return local_39;
}

Assistant:

bool operator()(TParseContextBase& parseContext, TPpContext& ppContext,
                  TInputScanner& fullInput, bool versionWillBeError,
                  TSymbolTable&, TIntermediate& intermediate,
                  EShOptimizationLevel optLevel, EShMessages messages)
    {
        bool success = true;
        // Parse the full shader.
        if (! parseContext.parseShaderStrings(ppContext, fullInput, versionWillBeError))
            success = false;

        if (success && intermediate.getTreeRoot()) {
            if (optLevel == EShOptNoGeneration)
                parseContext.infoSink.info.message(EPrefixNone, "No errors.  No code generation or linking was requested.");
            else
                success = intermediate.postProcess(intermediate.getTreeRoot(), parseContext.getLanguage());
        } else if (! success) {
            parseContext.infoSink.info.prefix(EPrefixError);
            parseContext.infoSink.info << parseContext.getNumErrors() << " compilation errors.  No code generated.\n\n";
        }

        if (messages & EShMsgAST)
            intermediate.output(parseContext.infoSink, true);

        return success;
    }